

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

void __thiscall
DLoadSaveMenu::DLoadSaveMenu(DLoadSaveMenu *this,DMenu *parent,FListMenuDescriptor *desc)

{
  int iVar1;
  int iVar2;
  int listboxHeight1;
  FListMenuDescriptor *desc_local;
  DMenu *parent_local;
  DLoadSaveMenu *this_local;
  
  DListMenu::DListMenu(&this->super_DListMenu,parent,desc);
  (this->super_DListMenu).super_DMenu.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00b62d58;
  ReadSaveStrings();
  this->savepicLeft = 10;
  this->savepicTop = CleanYfac * 0x36;
  iVar1 = DCanvas::GetWidth((DCanvas *)screen);
  this->savepicWidth = (iVar1 * 0xd8) / 0x280;
  iVar1 = DCanvas::GetHeight((DCanvas *)screen);
  this->savepicHeight = (iVar1 * 0x87) / 400;
  iVar1 = FFont::GetHeight(SmallFont);
  this->rowHeight = (iVar1 + 1) * CleanYfac;
  this->listboxLeft = this->savepicLeft + 0xe + this->savepicWidth;
  this->listboxTop = this->savepicTop;
  iVar1 = DCanvas::GetWidth((DCanvas *)screen);
  this->listboxWidth = (iVar1 - this->listboxLeft) + -10;
  iVar1 = DCanvas::GetHeight((DCanvas *)screen);
  this->listboxRows = ((iVar1 - this->listboxTop) + -0xb) / this->rowHeight;
  this->listboxHeight = this->listboxRows * this->rowHeight + 1;
  this->listboxRight = this->listboxLeft + this->listboxWidth;
  this->listboxBottom = this->listboxTop + this->listboxHeight;
  this->commentLeft = this->savepicLeft;
  this->commentTop = this->savepicTop + 0x10 + this->savepicHeight;
  this->commentWidth = this->savepicWidth;
  iVar1 = DCanvas::GetHeight((DCanvas *)screen);
  iVar2 = 0;
  if (200 < iVar1) {
    iVar2 = 10;
  }
  this->commentHeight = (iVar2 + 0x33) * CleanYfac;
  this->commentRight = this->commentLeft + this->commentWidth;
  this->commentBottom = this->commentTop + this->commentHeight;
  return;
}

Assistant:

DLoadSaveMenu::DLoadSaveMenu(DMenu *parent, FListMenuDescriptor *desc)
: DListMenu(parent, desc)
{
	ReadSaveStrings();

	savepicLeft = 10;
	savepicTop = 54*CleanYfac;
	savepicWidth = 216*screen->GetWidth()/640;
	savepicHeight = 135*screen->GetHeight()/400;

	rowHeight = (SmallFont->GetHeight() + 1) * CleanYfac;
	listboxLeft = savepicLeft + savepicWidth + 14;
	listboxTop = savepicTop;
	listboxWidth = screen->GetWidth() - listboxLeft - 10;
	int listboxHeight1 = screen->GetHeight() - listboxTop - 10;
	listboxRows = (listboxHeight1 - 1) / rowHeight;
	listboxHeight = listboxRows * rowHeight + 1;
	listboxRight = listboxLeft + listboxWidth;
	listboxBottom = listboxTop + listboxHeight;

	commentLeft = savepicLeft;
	commentTop = savepicTop + savepicHeight + 16;
	commentWidth = savepicWidth;
	commentHeight = (51+(screen->GetHeight()>200?10:0))*CleanYfac;
	commentRight = commentLeft + commentWidth;
	commentBottom = commentTop + commentHeight;
}